

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_for(CTcParser *this,int *err)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  CTPNStmEnclosing *stm;
  CTPNStm *body;
  int *in_RSI;
  CTcParser *in_RDI;
  bool bVar4;
  CTPNStm *body_stm;
  CTPNStmEnclosing *old_enclosing;
  CTPNStmFor *for_stm;
  int cont_to_reinit;
  CTcSymLocal *lcl;
  CTcPrsNode *expr;
  int done;
  CTPNForIn *in_tail;
  CTPNForIn *in_head;
  int found_in;
  CTcPrsNode *reinit_expr;
  CTcPrsNode *cond_expr;
  CTcPrsNode *init_expr;
  tcprs_scope_t scope_data;
  long linenum;
  CTcTokFileDesc *file;
  CTcSymbol *in_stack_ffffffffffffff08;
  int errnum;
  CTcTokenizer *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  tc_toktyp_t in_stack_ffffffffffffff1c;
  CTcParser *in_stack_ffffffffffffff20;
  CTcPrsNode *in_stack_ffffffffffffff28;
  CTcPrsNode *in_stack_ffffffffffffff30;
  CTcPrsSymtab *in_stack_ffffffffffffff38;
  tc_toktyp_t in_stack_ffffffffffffff40;
  tc_toktyp_t in_stack_ffffffffffffff44;
  CTPNStmEnclosing *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  CTcSymLocal *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int iVar5;
  undefined4 in_stack_ffffffffffffff6c;
  CTcPrsNode *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  CTcPrsNode *lval;
  CTcParser *this_00;
  CTcPrsNode *local_48;
  tcprs_scope_t local_40;
  long local_28;
  CTcTokFileDesc *local_20;
  int *local_18;
  CTPNStmForBase *local_8;
  
  local_18 = in_RSI;
  CTcTokenizer::get_last_pos(G_tok,&local_20,&local_28);
  enter_scope(in_RDI,&local_40);
  tVar2 = CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (tVar2 == TOKT_LPAR) {
    CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                      );
  }
  else {
    CTcTokenizer::log_error_curtok
              (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  local_48 = (CTcPrsNode *)0x0;
  bVar1 = false;
  this_00 = (CTcParser *)0x0;
  lval = (CTcPrsNode *)0x0;
  iVar6 = 0;
LAB_002bbf20:
  do {
    iVar3 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (iVar6 != 0) {
LAB_002bc385:
      errnum = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc394);
      if (tVar2 == TOKT_SEM) {
        iVar5 = 1;
        CTcTokenizer::next((CTcTokenizer *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc3c3);
        if (tVar2 != TOKT_SEM) {
          parse_cond_expr((CTcParser *)in_stack_ffffffffffffff10);
        }
        in_stack_ffffffffffffff1c = CTcTokenizer::cur((CTcTokenizer *)0x2bc3e9);
        if ((in_stack_ffffffffffffff1c == TOKT_RPAR) ||
           (in_stack_ffffffffffffff1c - TOKT_LBRACE < 2)) {
          CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff10,errnum);
          iVar5 = 0;
        }
        else if (in_stack_ffffffffffffff1c == TOKT_SEM) {
          CTcTokenizer::next((CTcTokenizer *)CONCAT44(0x2a,in_stack_ffffffffffffff18));
        }
        else {
          CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff10,errnum);
        }
        if ((iVar5 != 0) &&
           (tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc468), tVar2 != TOKT_RPAR)) {
          parse_expr((CTcParser *)0x2bc477);
        }
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc48e);
        if (tVar2 == TOKT_RPAR) {
          CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
        else {
          CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff10,errnum);
        }
      }
      else {
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc4c9);
        if (tVar2 == TOKT_RPAR) {
          CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
      }
      local_8 = (CTPNStmForBase *)CTcPrsAllocObj::operator_new(0x2bc4e9);
      CTPNStmFor::CTPNStmFor
                ((CTPNStmFor *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (CTcPrsNode *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(CTPNForIn *)in_stack_ffffffffffffff20,
                 (CTcPrsSymtab *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff50);
      stm = set_enclosing_stm(in_RDI,&local_8->super_CTPNStmEnclosing);
      body = parse_stm(this_00,(int *)lval,
                       (CTPNStmSwitch *)CONCAT44(iVar6,in_stack_ffffffffffffff88),iVar3);
      set_enclosing_stm(in_RDI,stm);
      if (*local_18 == 0) {
        CTPNStmForBase::set_body(local_8,body);
        CTPNStmBase::set_source_pos((CTPNStmBase *)local_8,local_20,local_28);
        CTPNStmForBase::set_has_own_scope
                  (local_8,(uint)(in_RDI->local_symtab_ != local_40.local_symtab));
        leave_scope(in_RDI,&local_40);
      }
      else {
        local_8 = (CTPNStmForBase *)0x0;
      }
      return (CTPNStm *)local_8;
    }
    in_stack_ffffffffffffff80 = (CTcPrsNode *)0x0;
    in_stack_ffffffffffffff44 = CTcTokenizer::cur((CTcTokenizer *)0x2bbf4e);
    if (in_stack_ffffffffffffff44 == TOKT_RPAR) {
      if (bVar1) {
        iVar6 = 1;
        goto LAB_002bc247;
      }
LAB_002bc170:
      CTcTokenizer::log_error_curtok
                (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      iVar6 = 1;
    }
    else {
      if (in_stack_ffffffffffffff44 - TOKT_LBRACE < 2) goto LAB_002bc170;
      if (in_stack_ffffffffffffff44 == TOKT_SEM) {
        iVar6 = 1;
        if (local_48 != (CTcPrsNode *)0x0) {
          CTcTokenizer::log_error(0x2b39);
        }
      }
      else if (in_stack_ffffffffffffff44 == TOKT_LOCAL) {
        create_scope_local_symtab(in_stack_ffffffffffffff20);
        tVar2 = CTcTokenizer::next((CTcTokenizer *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (tVar2 == TOKT_SYM) {
          in_stack_ffffffffffffff38 = in_RDI->local_symtab_;
          alloc_local(in_RDI);
          CTcPrsSymtab::add_local
                    ((CTcPrsSymtab *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          in_stack_ffffffffffffff40 =
               CTcTokenizer::next((CTcTokenizer *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          if (in_stack_ffffffffffffff40 == TOKT_SYM) {
            CTcTokenizer::getcur(G_tok);
            iVar3 = CTcToken::text_matches
                              ((CTcToken *)in_stack_ffffffffffffff20,
                               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                               ,(size_t)in_stack_ffffffffffffff10);
            if (iVar3 == 0) goto LAB_002bc0f9;
            CTcTokenizer::next((CTcTokenizer *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            in_stack_ffffffffffffff30 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2bc074);
            CTPNSymResolved::CTPNSymResolved
                      ((CTPNSymResolved *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            in_stack_ffffffffffffff80 =
                 parse_for_in_clause(this_00,lval,
                                     (CTPNForIn **)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                                     (CTPNForIn **)in_stack_ffffffffffffff80);
            bVar1 = true;
            if (in_stack_ffffffffffffff80 == (CTcPrsNode *)0x0) {
              iVar6 = 1;
            }
          }
          else if ((in_stack_ffffffffffffff40 == TOKT_EQ) || (in_stack_ffffffffffffff40 == TOKT_ASI)
                  ) {
            in_stack_ffffffffffffff80 =
                 parse_local_initializer
                           ((CTcParser *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          }
          else {
LAB_002bc0f9:
            CTcTokenizer::log_error_curtok
                      (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          }
        }
        else {
          CTcTokenizer::log_error_curtok
                    (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        }
      }
      else {
        in_stack_ffffffffffffff80 = parse_asi_expr((CTcParser *)0x2bc19e);
        if (in_stack_ffffffffffffff80 == (CTcPrsNode *)0x0) {
          iVar6 = 1;
        }
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc1c5);
        if (tVar2 == TOKT_SYM) {
          CTcTokenizer::getcur(G_tok);
          iVar3 = CTcToken::text_matches
                            ((CTcToken *)in_stack_ffffffffffffff20,
                             (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             (size_t)in_stack_ffffffffffffff10);
          if (iVar3 != 0) {
            CTcTokenizer::next((CTcTokenizer *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            in_stack_ffffffffffffff80 =
                 parse_for_in_clause(this_00,lval,
                                     (CTPNForIn **)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                                     (CTPNForIn **)in_stack_ffffffffffffff80);
            bVar1 = true;
            if (in_stack_ffffffffffffff80 == (CTcPrsNode *)0x0) {
              iVar6 = 1;
            }
          }
        }
      }
    }
LAB_002bc247:
    if ((in_stack_ffffffffffffff80 != (CTcPrsNode *)0x0) &&
       (bVar4 = local_48 != (CTcPrsNode *)0x0, local_48 = in_stack_ffffffffffffff80, bVar4)) {
      in_stack_ffffffffffffff28 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2bc264);
      CTPNComma::CTPNComma
                ((CTPNComma *)in_stack_ffffffffffffff20,
                 (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (CTcPrsNode *)in_stack_ffffffffffffff10);
      local_48 = in_stack_ffffffffffffff28;
    }
    iVar3 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (iVar6 != 0) goto LAB_002bc385;
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2bc2e1);
    in_stack_ffffffffffffff20 = (CTcParser *)(ulong)(tVar2 - TOKT_RPAR);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    switch(in_stack_ffffffffffffff20) {
    case (CTcParser *)0x0:
      if (bVar1) {
        iVar6 = 1;
        break;
      }
    case (CTcParser *)0x3:
    case (CTcParser *)0x4:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff10,iVar3);
      iVar6 = 1;
      break;
    case (CTcParser *)0x1:
      CTcTokenizer::next((CTcTokenizer *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    default:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff10,iVar3);
      CTcTokenizer::next((CTcTokenizer *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case (CTcParser *)0x16:
      goto switchD_002bc303_caseD_16;
    }
  } while( true );
switchD_002bc303_caseD_16:
  iVar6 = 1;
  goto LAB_002bbf20;
}

Assistant:

CTPNStm *CTcParser::parse_for(int *err)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    tcprs_scope_t scope_data;
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOR_LPAR);
    }

    /* we don't have any of the expressions yet */
    CTcPrsNode *init_expr = 0;
    CTcPrsNode *cond_expr = 0;
    CTcPrsNode *reinit_expr = 0;
    int found_in = FALSE;

    /* "in" expression list */
    CTPNForIn *in_head = 0, *in_tail = 0;

    /* parse the initializer list */
    for (int done = FALSE ; !done ; )
    {
        /* presume we won't find an expression on this round */
        CTcPrsNode *expr = 0;
        
        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_LOCAL:
            /* 
             *   if we haven't created our own symbol table local to the
             *   'for' loop, do so now 
             */
            create_scope_local_symtab();
            
            /* skip the 'local' keyword and get the local name */
            if (G_tok->next() == TOKT_SYM)
            {
                /* add the local symbol */
                CTcSymLocal *lcl = local_symtab_->add_local(alloc_local());

                /* check for the required initializer */
                switch(G_tok->next())
                {
                case TOKT_ASI:
                case TOKT_EQ:
                    /* parse the initializer */
                    expr = parse_local_initializer(lcl, err);
                    break;

                case TOKT_SYM:
                    /* check for an 'in' expression */
                    if (G_tok->getcur()->text_matches("in", 2))
                    {
                        /* parse the 'var in expr' or 'var in from..to' */
                        G_tok->next();
                        expr = parse_for_in_clause(
                            new CTPNSymResolved(lcl), in_head, in_tail);

                        /* note the "in" */
                        found_in = TRUE;

                        /* if that failed, stop scanning the initializer */
                        if (expr == 0)
                            done = TRUE;
                    }
                    else
                    {
                        /* anything else is an error */
                        goto req_asi;
                    }
                    break;
                    
                default:
                req_asi:
                    /* log an error - an initializer is required */
                    G_tok->log_error_curtok(TCERR_REQ_FOR_LOCAL_INIT);
                    break;
                }
            }
            else
            {
                /* 
                 *   the 'local' statement isn't constructed properly -
                 *   this is difficult to recover from intelligently, so
                 *   just log an error and keep going from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
                break;
            }
            break;

        case TOKT_SEM:
            /* it's a semicolon - we're done with the initializer list */
            done = TRUE;

            /* 
             *   if we have an expression already, it means that the
             *   previous token was a comma - this is an error, since we
             *   have a missing expression; log the error but continue
             *   anyway 
             */
            if (init_expr != 0)
                G_tok->log_error(TCERR_MISSING_FOR_INIT_EXPR);
            break;

        case TOKT_RPAR:
            /* if we found an "in", we can end early */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the missing part error... */
            /* FALL THROUGH */

        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* premature end of the list - log an error and stop */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* 
             *   This must be an expression - parse it.  Parse an
             *   assignment expression, not a comma expression, because we
             *   must check for a "local" clause after each comma. 
             */
            expr = parse_asi_expr();

            /* if that failed, stop scanning the "for" */
            if (expr == 0)
                done = TRUE;

            /* check for an 'in' expression */
            if (G_tok->cur() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* skip the "in" and parse the collection/range */
                G_tok->next();
                expr = parse_for_in_clause(expr, in_head, in_tail);

                /* note the "in" */
                found_in = TRUE;
                
                /* if that failed, stop parsing the initializer */
                if (expr == 0)
                    done = TRUE;
            }

            /* done with this clause */
            break;
        }

        /* 
         *   if we got an expression, add it into the initializer
         *   expression under construction by adding it under a "comma"
         *   node 
         */
        if (expr != 0)
        {
            /* 
             *   if there's an expression, build a comma expression for
             *   the expression so far plus the new expression; otherwise,
             *   the new expression becomes the entire expression so far 
             */
            if (init_expr != 0)
                init_expr = new CTPNComma(init_expr, expr);
            else
                init_expr = expr;
        }

        /* if we're done, we can stop now */
        if (done)
            break;

        /* 
         *   we must have a semicolon or comma after each initializer
         *   expression 
         */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* that's the end of the statement - stop now */
            done = TRUE;
            break;

        case TOKT_COMMA:
            /* skip the comma and parse the next initializer */
            G_tok->next();
            break;

        case TOKT_RPAR:
            /* if we found an "in" clause, we only need an initializer */
            if (found_in)
            {
                done = TRUE;
                break;
            }

            /* otherwise, fall through to the error case... */
            /* FALL THROUGH */
            
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* log an error, and stop parsing the expression list */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);
            done = TRUE;
            break;

        default:
            /* log an error */
            G_tok->log_error_curtok(TCERR_REQ_FOR_INIT_COMMA);

            /* skip the errant token and keep going */
            G_tok->next();
            break;
        }
    }

    /* 
     *   if we successfully found the ';' at the end of the initializer
     *   list, parse the condition expression 
     */
    if (G_tok->cur() == TOKT_SEM)
    {
        int cont_to_reinit;

        /* presume we'll want to continue to the reinit expression */
        cont_to_reinit = TRUE;

        /* skip the ';' */
        G_tok->next();
        
        /* if the condition isn't empty, parse it */
        if (G_tok->cur() != TOKT_SEM)
            cond_expr = parse_cond_expr();

        /* require the ';' after the expression */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* it's fine - keep going from here */
            G_tok->next();
            break;

        case TOKT_RPAR:
        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* missing part */
            G_tok->log_error_curtok(TCERR_MISSING_FOR_PART);

            /* don't bother trying to find a reinitialization expression */
            cont_to_reinit = FALSE;
            break;

        default:
            /* 
             *   we seem to be missing the semicolon; keep going from
             *   here, assuming that they simply left out the semicolon
             *   between the condition and reinitializer expressions 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_COND_SEM);
            break;
        }

        /* 
         *   if we're to continue to the reinitializer, parse it; there is
         *   no reinitialization expression if the next token is a right
         *   paren 
         */
        if (cont_to_reinit && G_tok->cur() != TOKT_RPAR)
        {
            /* parse the expression */
            reinit_expr = parse_expr();
        }

        /* make sure we have the right paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* 
             *   log an error, and try parsing the body from here, on the
             *   assumption that they simply forgot about the right paren
             *   and jumped right into the body 
             */
            G_tok->log_error_curtok(TCERR_REQ_FOR_RPAR);
        }
    }
    else if (G_tok->cur() == TOKT_RPAR)
    {
        /* 
         *   We already found the right paren - early, so we logged an error
         *   if necessary (it's an error in most cases, but *not* if there's
         *   an 'in' clause in the initializer list).  Simply skip it now so
         *   that we can proceed to the body of the 'for'.  
         */
        G_tok->next();
    }

    /* create the "for" node */
    CTPNStmFor *for_stm = new CTPNStmFor(
        init_expr, cond_expr, reinit_expr, in_head,
        local_symtab_, enclosing_stm_);

    /* set the 'for' to enclose its body */
    CTPNStmEnclosing *old_enclosing = set_enclosing_stm(for_stm);

    /* parse the body of the "for" loop */
    CTPNStm *body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    for_stm->set_body(body_stm);

    /* set the original statement position in the node */
    for_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    for_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the "for" node */
    return for_stm;
}